

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<unsigned_long> __thiscall
kj::
Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>,_kj::HashIndex<kj::_::(anonymous_namespace)::StringLengthCompare>_>
::Impl<0UL,_false>::insert
          (Impl<0UL,_false> *this,
          Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *table,
          size_t pos,StringPtr *row,uint skip)

{
  StringPtr *pSVar1;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  ArrayPtr<kj::StringPtr> table_00;
  Maybe<unsigned_long> MVar3;
  bool success;
  char *local_78;
  size_t sStack_70;
  ArrayDisposer local_68;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_table_h:450:5)>
  local_60;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar2;
  
  local_68._vptr_ArrayDisposer = (_func_int **)pos;
  if (skip == 0) {
    MVar3 = Impl<1UL,_false>::insert((Impl<1UL,_false> *)this,table,pos,row,0);
    aVar2 = MVar3.ptr.field_1;
  }
  else {
    pSVar1 = (table->rows).builder.ptr;
    local_78 = (row->content).ptr;
    sStack_70 = (row->content).size_;
    table_00.size_ = (size_t)pSVar1;
    table_00.ptr = (StringPtr *)&table->indexes;
    MVar3 = HashIndex<kj::_::(anonymous_namespace)::StringHasher>::
            insert<kj::StringPtr,kj::StringPtr>
                      ((HashIndex<kj::_::(anonymous_namespace)::StringHasher> *)&local_60,table_00,
                       (long)(table->rows).builder.pos - (long)pSVar1 >> 4,(StringPtr *)pos);
    aVar2 = MVar3.ptr.field_1;
    if (local_60.maybeFunc.ptr.isSet == true) {
      *this = (Impl<0UL,_false>)0x1;
      *(bool **)(this + 8) = local_60.maybeFunc.ptr.field_1.value.success;
    }
    else {
      local_78 = (char *)((ulong)local_78 & 0xffffffffffffff00);
      local_60.maybeFunc.ptr.isSet = true;
      local_60.maybeFunc.ptr.field_1.value.pos = (size_t *)&local_68;
      local_60.maybeFunc.ptr.field_1.value.success = (bool *)&local_78;
      local_60.maybeFunc.ptr.field_1.value.indexObj = &table->indexes;
      local_60.maybeFunc.ptr.field_1.value.table = table;
      local_60.maybeFunc.ptr.field_1.value.row = row;
      Impl<1UL,_false>::insert
                ((Impl<1UL,_false> *)this,table,(size_t)local_68._vptr_ArrayDisposer,row,skip);
      local_78 = (char *)(CONCAT71(local_78._1_7_,*this) ^ 1);
      _::
      Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.h:450:5)>
      ::~Deferred(&local_60);
      aVar2 = extraout_RDX;
    }
  }
  MVar3.ptr.field_1.value = aVar2.value;
  MVar3.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar3.ptr;
}

Assistant:

static kj::Maybe<size_t> insert(Table<Row, Indexes...>& table, size_t pos, Row& row, uint skip) {
    if (skip == index) {
      return Impl<index + 1>::insert(table, pos, row, skip);
    }
    auto& indexObj = get<index>(table.indexes);
    KJ_IF_SOME(existing, indexObj.insert(table.rows.asPtr(), pos, indexObj.keyForRow(row))) {
      return existing;
    }

    bool success = false;
    KJ_DEFER(if (!success) {
      indexObj.erase(table.rows.asPtr(), pos, indexObj.keyForRow(row));
    });
    auto result = Impl<index + 1>::insert(table, pos, row, skip);
    success = result == kj::none;
    return result;
  }